

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::~SystemInformationImplementation
          (SystemInformationImplementation *this)

{
  std::__cxx11::string::~string((string *)&this->OSPlatform);
  std::__cxx11::string::~string((string *)&this->OSVersion);
  std::__cxx11::string::~string((string *)&this->OSRelease);
  std::__cxx11::string::~string((string *)&this->Hostname);
  std::__cxx11::string::~string((string *)&this->OSName);
  std::__cxx11::string::~string((string *)&this->SysCtlBuffer);
  tagID::~tagID(&this->ChipID);
  return;
}

Assistant:

SystemInformationImplementation::~SystemInformationImplementation()
{
}